

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UniqueIdentifier.hpp
# Opt level: O0

UniqueIdentifier __thiscall
Diligent::UniqueIdHelper<GLObjectWrappers::GLBufferObjCreateReleaseHelper>::GetID
          (UniqueIdHelper<GLObjectWrappers::GLBufferObjCreateReleaseHelper> *this)

{
  int iVar1;
  UniqueIdHelper<GLObjectWrappers::GLBufferObjCreateReleaseHelper> *this_local;
  
  if (this->m_ID == 0) {
    LOCK();
    UNLOCK();
    iVar1 = (int)GetID::GlobalCounter.super___atomic_base<int>._M_i + 1;
    GetID::GlobalCounter.super___atomic_base<int>._M_i =
         (__atomic_base<int>)
         (__atomic_base<int>)(GetID::GlobalCounter.super___atomic_base<int>._M_i + 1)._M_i;
    this->m_ID = iVar1;
  }
  return this->m_ID;
}

Assistant:

UniqueIdentifier GetID() const noexcept
    {
        if (m_ID == 0)
        {
            static std::atomic<UniqueIdentifier> GlobalCounter{0};
            m_ID = GlobalCounter.fetch_add(1) + 1;
        }
        return m_ID;
    }